

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh.cc
# Opt level: O2

int pkey_dh_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  
  iVar1 = pkey_dh_init(dst);
  if (iVar1 != 0) {
    *(undefined4 *)dst->data = *src->data;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int pkey_dh_copy(EVP_PKEY_CTX *dst, EVP_PKEY_CTX *src) {
  if (!pkey_dh_init(dst)) {
    return 0;
  }

  const DH_PKEY_CTX *sctx = reinterpret_cast<DH_PKEY_CTX *>(src->data);
  DH_PKEY_CTX *dctx = reinterpret_cast<DH_PKEY_CTX *>(dst->data);
  dctx->pad = sctx->pad;
  return 1;
}